

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_holy_word(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int size;
  int iVar4;
  int iVar5;
  int number;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_EDI;
  int in_R8D;
  int wrath_num;
  int sanc_num;
  int frenzy_num;
  int curse_num;
  int bless_num;
  int dam;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  int in_stack_0000007c;
  void *in_stack_00000080;
  CHAR_DATA *in_stack_00000088;
  int in_stack_00000090;
  int in_stack_00000094;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  CHAR_DATA *in_stack_ffffffffffffffd0;
  CHAR_DATA *ch_00;
  int in_stack_ffffffffffffffe0;
  
  bVar2 = is_good((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (bVar2) {
    iVar3 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    iVar3 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  size = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar4 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar5 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
  number = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
  act((char *)in_stack_ffffffffffffffd0,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),
      (void *)CONCAT44(iVar5,number),(void *)CONCAT44(size,iVar3),0);
  send_to_char((char *)in_stack_ffffffffffffffd0,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
  pCVar1 = in_RDX->in_room->people;
  while (ch_00 = pCVar1, ch_00 != (CHAR_DATA *)0x0) {
    in_stack_ffffffffffffffd0 = ch_00->next_in_room;
    pCVar1 = in_stack_ffffffffffffffd0;
    if (ch_00->invis_level < 0x34) {
      bVar2 = is_good((CHAR_DATA *)CONCAT44(size,iVar3));
      if ((((bVar2) && (bVar2 = is_good((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2)) ||
          ((bVar2 = is_evil((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2 &&
           (bVar2 = is_evil((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2)))) ||
         (((bVar2 = is_neutral((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2 &&
           (bVar2 = is_neutral((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2)) && (in_RDX == ch_00)))) {
        send_to_char((char *)in_stack_ffffffffffffffd0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
        spell_frenzy(sn,level,ch,vo,target);
        spell_bless(sn,level,ch,vo,target);
        pCVar1 = in_stack_ffffffffffffffd0;
      }
      else {
        bVar2 = is_good((CHAR_DATA *)CONCAT44(size,iVar3));
        if (((bVar2) && (bVar2 = is_evil((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2)) ||
           ((bVar2 = is_evil((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2 &&
            (bVar2 = is_good((CHAR_DATA *)CONCAT44(size,iVar3)), bVar2)))) {
          bVar2 = is_safe_spell(_frenzy_num,_wrath_num,SUB41((uint)in_EDI >> 0x18,0));
          pCVar1 = in_stack_ffffffffffffffd0;
          if (!bVar2) {
            spell_curse(in_stack_00000094,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                        in_stack_0000007c);
            send_to_char((char *)in_stack_ffffffffffffffd0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
            bVar2 = is_good((CHAR_DATA *)CONCAT44(size,iVar3));
            if (bVar2) {
              spell_wrath(in_R8D,in_stack_ffffffffffffffe0,ch_00,in_stack_ffffffffffffffd0,
                          in_stack_ffffffffffffffcc);
              pCVar1 = in_stack_ffffffffffffffd0;
            }
            else {
              spell_dark_wrath(in_R8D,in_stack_ffffffffffffffe0,ch_00,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffcc);
              pCVar1 = in_stack_ffffffffffffffd0;
            }
          }
        }
        else {
          bVar2 = is_neutral((CHAR_DATA *)CONCAT44(size,iVar3));
          pCVar1 = in_stack_ffffffffffffffd0;
          if ((bVar2) &&
             (bVar2 = is_safe_spell(_frenzy_num,_wrath_num,SUB41((uint)in_EDI >> 0x18,0)),
             pCVar1 = in_stack_ffffffffffffffd0, !bVar2)) {
            spell_curse(in_stack_00000094,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                        in_stack_0000007c);
            send_to_char((char *)in_stack_ffffffffffffffd0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
            in_stack_ffffffffffffffcc = dice(number,size);
            damage_old(in_RDX,in_RCX,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)ch_00 >> 0x20),
                       SUB81((ulong)ch_00 >> 0x18,0));
            pCVar1 = in_stack_ffffffffffffffd0;
          }
        }
      }
    }
  }
  send_to_char((char *)in_stack_ffffffffffffffd0,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,iVar4));
  in_RDX->hit = in_RDX->hit + -100;
  return;
}

Assistant:

void spell_holy_word(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	int dam;
	int bless_num, curse_num, frenzy_num, sanc_num;
	int wrath_num;

	if (is_good(ch))
		wrath_num = skill_lookup("wrath");
	else
		wrath_num = skill_lookup("dark wrath");

	sanc_num = skill_lookup("sanctuary");
	bless_num = skill_lookup("bless");
	curse_num = skill_lookup("curse");
	frenzy_num = skill_lookup("frenzy");

	act("$n utters a word of divine power!", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You utter a word of divine power.\n\r", ch);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (vch->invis_level > LEVEL_HERO)
			continue;

		if ((is_good(ch) && is_good(vch))
			|| (is_evil(ch) && is_evil(vch))
			|| ((is_neutral(ch) && is_neutral(vch)) && ch == vch))
		{
			send_to_char("You feel more powerful.\n\r", vch);
			spell_frenzy(frenzy_num, level, ch, (void *)vch, TARGET_CHAR);
			spell_bless(bless_num, level, ch, (void *)vch, TARGET_CHAR);
		}
		else if ((is_good(ch) && is_evil(vch))
			|| (is_evil(ch) && is_good(vch)))
		{
			if (!is_safe_spell(ch, vch, true))
			{
				spell_curse(curse_num, level, ch, (void *)vch, TARGET_CHAR);
				send_to_char("You are struck down!\n\r", vch);

				if (is_good(ch))
					spell_wrath(wrath_num, level, ch, (void *)vch, TARGET_CHAR);
				else
					spell_dark_wrath(wrath_num, level, ch, (void *)vch, TARGET_CHAR);

				/*
				dam = dice(level,6);
				damage_old(ch,vch,dam,sn,DAM_ENERGY,true);
				*/
			}
		}
		else if (is_neutral(ch))
		{
			if (!is_safe_spell(ch, vch, true))
			{
				spell_curse(curse_num, level / 2, ch, (void *)vch, TARGET_CHAR);
				send_to_char("You are struck down!\n\r", vch);
				dam = dice(level, 4);
				damage_old(ch, vch, dam, sn, DAM_ENERGY, true);
			}
		}
	}

	send_to_char("You feel drained.\n\r", ch);
	ch->hit -= 100;
}